

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZydisFuzzEncoder.c
# Opt level: O3

void ZydisCompareRequestToInstruction
               (ZydisEncoderRequest *request,ZydisDecodedInstruction *insn,
               ZydisDecodedOperand *operands,ZyanU8 *insn_bytes)

{
  ZydisRegister ZVar1;
  ZydisInstructionCategory ZVar2;
  ZydisDecodedOperand *pZVar3;
  byte bVar4;
  ZyanStatus ZVar5;
  ZydisMachineMode ZVar6;
  long lVar7;
  ZydisMnemonic *pZVar8;
  ZydisEncoderOperand *pZVar9;
  byte bVar10;
  ulong uVar11;
  size_t __nbytes;
  ZydisDecodedOperand *pZVar12;
  ZyanU8 *pZVar13;
  ZydisOperandType ZVar14;
  ZydisDecoder *decoder_00;
  bool bVar15;
  ZydisDecoder decoder;
  ZydisDecodedInstruction knc_insn;
  ZydisDecodedOperand knc_operands [10];
  ZydisDecoder ZStack_aec;
  ZyanUSize ZStack_ae0;
  ZyanU8 aZStack_ad7 [15];
  ZydisEncoderRequest ZStack_ac8;
  ZydisDecodedInstruction ZStack_938;
  ZydisDecodedOperand aZStack_7f0 [10];
  ZydisEncoderRequest *pZStack_4d0;
  ZydisDecodedInstruction *pZStack_4c8;
  ZydisDecodedOperand *pZStack_4c0;
  ZydisDecoder local_4b0;
  ZydisDecodedInstruction local_4a0;
  ZydisDecodedOperand local_358 [10];
  
  pZVar8 = &insn->mnemonic;
  if ((((request->mnemonic == ZYDIS_MNEMONIC_XCHG) && (request->operand_count == '\x02')) &&
      (request->operands[0].type == ZYDIS_OPERAND_TYPE_REGISTER)) &&
     (((request->operands[1].type == ZYDIS_OPERAND_TYPE_REGISTER &&
       (ZVar1 = request->operands[0].reg.value, ZVar1 == request->operands[1].reg.value)) &&
      ((*pZVar8 == ZYDIS_MNEMONIC_NOP &&
       ((ZVar1 < ZYDIS_REGISTER_RCX && ((0x20002000200000U >> ((ulong)ZVar1 & 0x3f) & 1) != 0)))))))
     ) {
    return;
  }
  if (request->mnemonic == *pZVar8) {
LAB_0010eb23:
    decoder_00 = (ZydisDecoder *)request->prefixes;
    ZVar6 = request->machine_mode;
    pZVar12 = (ZydisDecodedOperand *)0x1;
    if (((ulong)decoder_00 & ~insn->attributes) != 0) {
      if (((ulong)decoder_00 >> 0x27 & 1) == 0 || ZVar6 == ZYDIS_MACHINE_MODE_LONG_64) {
        pZVar12 = (ZydisDecodedOperand *)0x0;
      }
      else {
        decoder_00 = (ZydisDecoder *)((ulong)decoder_00 & 0xffffff6fffffffff | 0x1000000000);
        pZVar12 = (ZydisDecodedOperand *)
                  CONCAT71(0xffffff6fffffff,((ulong)decoder_00 & ~insn->attributes) == 0);
      }
    }
    if (((ZVar6 == insn->machine_mode) && (request->mnemonic == *pZVar8)) &&
       (bVar10 = request->operand_count,
       (bVar10 == insn->operand_count_visible & (byte)pZVar12) == 1)) {
      if (bVar10 != 0) {
        request = (ZydisEncoderRequest *)&request->operands[0].imm;
        decoder_00 = (ZydisDecoder *)0x0;
        do {
          ZVar14 = *(ZydisOperandType *)&request[-1].operands[4].mem.size;
          if (ZVar14 != operands->type) {
            pZStack_4c0 = (ZydisDecodedOperand *)0x10ed2e;
            ZydisCompareRequestToInstruction_cold_5();
LAB_0010ed2e:
            pZStack_4c0 = (ZydisDecodedOperand *)0x10ed36;
            ZydisCompareRequestToInstruction_cold_7();
LAB_0010ed36:
            pZStack_4c0 = (ZydisDecodedOperand *)0x10ed3e;
            ZydisCompareRequestToInstruction_cold_8();
LAB_0010ed3e:
            pZStack_4c0 = (ZydisDecodedOperand *)0x10ed46;
            ZydisCompareRequestToInstruction_cold_6();
LAB_0010ed46:
            pZStack_4c0 = (ZydisDecodedOperand *)0x10ed4e;
            ZydisCompareRequestToInstruction_cold_9();
switchD_0010ebcf_default:
            pZStack_4c0 = (ZydisDecodedOperand *)0x10ed56;
            ZydisCompareRequestToInstruction_cold_10();
            goto LAB_0010ed56;
          }
          switch(ZVar14) {
          case ZYDIS_OPERAND_TYPE_REGISTER:
            if (*(ZydisMemoryOperandType *)&request[-1].operands[4].mem.field_0x1c !=
                (operands->field_10).mem.type) goto LAB_0010ed46;
            break;
          case ZYDIS_OPERAND_TYPE_MEMORY:
            ZVar1 = *(ZydisRegister *)&request[-1].operands[4].imm;
            pZVar12 = (ZydisDecodedOperand *)(ulong)ZVar1;
            if ((((ZVar1 != (operands->field_10).mem.base) ||
                 (*(ZydisRegister *)((long)&request[-1].operands[4].imm + 4) !=
                  (operands->field_10).mem.index)) ||
                (((char)request[-1].evex.broadcast != (operands->field_10).mem.scale &&
                 ((operands->field_10).mem.type != ZYDIS_MEMOP_TYPE_MIB)))) ||
               (*(long *)&request[-1].evex.sae != (operands->field_10).mem.disp.value)) {
              lVar7 = *(long *)&request[-1].evex.sae;
              if (lVar7 != (operands->field_10).mem.disp.value) {
                if (((*(char *)((long)&operands->field_10 + 0x21) == '\0') ||
                    (*(int *)((long)&request[-1].operands[4].imm + 4) != 0)) ||
                   ((1 < ZVar1 - ZYDIS_REGISTER_EIP && (ZVar1 != ZYDIS_REGISTER_NONE)))) {
                  bVar15 = false;
                }
                else {
                  pZStack_4c0 = (ZydisDecodedOperand *)0x10ed03;
                  pZVar12 = operands;
                  ZydisCalcAbsoluteAddress(insn,operands,0,(ZyanU64 *)&local_4b0);
                  lVar7 = *(long *)&request[-1].evex.sae;
                  bVar15 = lVar7 == local_4b0._0_8_;
                  ZVar6 = insn->machine_mode;
                }
                if ((((ZVar6 < (ZYDIS_MACHINE_MODE_LEGACY_16|ZYDIS_MACHINE_MODE_LONG_COMPAT_16)) &&
                     ((0x34U >> (ZVar6 & 0x1f) & 1) != 0)) || (insn->stack_width == '\x10')) ||
                   (insn->address_width == '\x10')) {
                  bVar15 = (short)*(undefined4 *)((long)&operands->field_10 + 0x18) == (short)lVar7;
                }
                if (bVar15) {
                  bVar10 = insn->operand_count_visible;
                  break;
                }
              }
              goto LAB_0010ed36;
            }
            break;
          case ZYDIS_OPERAND_TYPE_POINTER:
            if (((short)request[-1].mvex.swizzle != (operands->field_10).ptr.segment) ||
               (ZVar1._0_1_ = request[-1].mvex.sae, ZVar1._1_1_ = request[-1].mvex.eviction_hint,
               ZVar1._2_2_ = *(undefined2 *)&request[-1].mvex.field_0x12,
               ZVar1 != (operands->field_10).mem.segment)) goto LAB_0010ed2e;
            break;
          case ZYDIS_OPERAND_TYPE_IMMEDIATE:
            pZVar12 = *(ZydisDecodedOperand **)request;
            pZVar3 = (ZydisDecodedOperand *)(operands->field_10).imm.value.u;
            if ((pZVar12 != pZVar3) &&
               (((ZVar2 = (insn->meta).category, ZVar2 != ZYDIS_CATEGORY_LOGICAL &&
                 (ZVar2 != ZYDIS_CATEGORY_DATAXFER)) ||
                ((0x3f < operands->size ||
                 ((((ulong)pZVar3 ^ (ulong)pZVar12) & ~(-1L << ((byte)operands->size & 0x3f))) != 0)
                 ))))) goto LAB_0010ed3e;
            break;
          default:
            goto switchD_0010ebcf_default;
          }
          decoder_00 = (ZydisDecoder *)((long)&decoder_00->machine_mode + 1);
          request = (ZydisEncoderRequest *)&request->operands[0].mem;
          operands = operands + 1;
        } while (decoder_00 < (ZydisDecoder *)(ulong)bVar10);
      }
      return;
    }
LAB_0010ed56:
    pZStack_4c0 = (ZydisDecodedOperand *)0x10ed5b;
    ZydisCompareRequestToInstruction_cold_4();
LAB_0010ed5b:
    pZStack_4c0 = (ZydisDecodedOperand *)0x10ed60;
    ZydisCompareRequestToInstruction_cold_1();
LAB_0010ed60:
    insn_bytes = &pZVar12->id;
    pZStack_4c0 = (ZydisDecodedOperand *)0x10ed65;
    ZydisCompareRequestToInstruction_cold_2();
  }
  else {
    pZVar12 = (ZydisDecodedOperand *)(ulong)insn->machine_mode;
    decoder_00 = &local_4b0;
    pZStack_4c0 = (ZydisDecodedOperand *)0x10eacd;
    ZVar5 = ZydisDecoderInit(decoder_00,insn->machine_mode,(uint)(insn->stack_width >> 5));
    if ((int)ZVar5 < 0) goto LAB_0010ed5b;
    decoder_00 = &local_4b0;
    pZVar12 = (ZydisDecodedOperand *)0x2;
    pZStack_4c0 = (ZydisDecodedOperand *)0x10eae9;
    ZVar5 = ZydisDecoderEnableMode(decoder_00,ZYDIS_DECODER_MODE_KNC,'\x01');
    if ((int)ZVar5 < 0) goto LAB_0010ed60;
    pZVar13 = &insn->length;
    decoder_00 = &local_4b0;
    insn = &local_4a0;
    operands = local_358;
    pZStack_4c0 = (ZydisDecodedOperand *)0x10eb16;
    ZVar5 = ZydisDecoderDecodeFull(decoder_00,insn_bytes,(ulong)*pZVar13,insn,operands);
    if (-1 < (int)ZVar5) {
      pZVar8 = &local_4a0.mnemonic;
      goto LAB_0010eb23;
    }
  }
  pZStack_4c0 = (ZydisDecodedOperand *)ZydisFuzzTarget;
  ZydisCompareRequestToInstruction_cold_3();
  pZStack_4d0 = request;
  pZStack_4c8 = insn;
  pZStack_4c0 = operands;
  lVar7 = (*(code *)decoder_00)(insn_bytes,&ZStack_ac8,400);
  if (lVar7 != 400) {
    ZydisFuzzTarget_cold_1();
    return;
  }
  bVar10 = ZStack_ac8.operand_count / 3 & 0xfe;
  ZStack_ac8.allowed_encodings = ZStack_ac8.allowed_encodings & ZYDIS_ENCODABLE_ENCODING_MAX_VALUE;
  ZStack_ac8.prefixes = ZStack_ac8.prefixes & 0x7fff8000000;
  ZStack_ac8.machine_mode = ZStack_ac8.machine_mode % 6;
  ZStack_ac8.mnemonic = ZStack_ac8.mnemonic % 0x704;
  ZStack_ac8.branch_type = ZStack_ac8.branch_type & ZYDIS_BRANCH_TYPE_FAR;
  ZStack_ac8.branch_width = ZStack_ac8.branch_width % 5;
  ZStack_ac8.address_size_hint = ZStack_ac8.address_size_hint & ZYDIS_ADDRESS_SIZE_HINT_64;
  ZStack_ac8.operand_size_hint = ZStack_ac8.operand_size_hint % 5;
  ZStack_ac8.evex.broadcast =
       ZStack_ac8.evex.broadcast -
       (ZStack_ac8.evex.broadcast / 0xd + (ZStack_ac8.evex.broadcast / 0xd) * 0xc);
  ZStack_ac8.evex.rounding = ZStack_ac8.evex.rounding % 5;
  ZStack_ac8.mvex.broadcast =
       ZStack_ac8.mvex.broadcast -
       (ZStack_ac8.mvex.broadcast / 0xd + (ZStack_ac8.mvex.broadcast / 0xd) * 0xc);
  ZStack_ac8.mvex.conversion = ZStack_ac8.mvex.conversion % 6;
  ZStack_ac8.mvex.rounding = ZStack_ac8.mvex.rounding % 5;
  ZStack_ac8.mvex.swizzle = ZStack_ac8.mvex.swizzle % 9;
  bVar4 = ZStack_ac8.operand_count + bVar10 * -3;
  if (bVar4 != 0) {
    pZVar9 = ZStack_ac8.operands;
    uVar11 = 0;
    do {
      ZVar14 = pZVar9->type & ZYDIS_OPERAND_TYPE_POINTER;
      pZVar9->type = ZVar14 + ZYDIS_OPERAND_TYPE_REGISTER;
      if (1 < ZVar14 - ZYDIS_OPERAND_TYPE_MEMORY) {
        lVar7 = 4;
        if (ZVar14 != ZYDIS_OPERAND_TYPE_UNUSED) {
          (pZVar9->mem).base = (pZVar9->mem).base % 0x10b;
          lVar7 = 0x14;
        }
        *(uint *)((long)&pZVar9->type + lVar7) = *(uint *)((long)&pZVar9->type + lVar7) % 0x10b;
      }
      uVar11 = uVar11 + 1;
      pZVar9 = pZVar9 + 1;
    } while (uVar11 < bVar4);
  }
  ZStack_ae0 = 0xf;
  ZStack_ac8.operand_count = ZStack_ac8.operand_count + bVar10 * -3;
  ZVar5 = ZydisEncoderEncodeInstruction(&ZStack_ac8,aZStack_ad7,&ZStack_ae0);
  if ((int)ZVar5 < 0) {
    return;
  }
  pZVar13 = (ZyanU8 *)(ulong)ZStack_ac8.machine_mode;
  if ((ZyanU8 *)0x5 < pZVar13) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/tools/ZydisFuzzEncoder.c"
                  ,0x118,"int ZydisFuzzTarget(ZydisStreamRead, void *)");
  }
  ZVar5 = ZydisDecoderInit(&ZStack_aec,ZStack_ac8.machine_mode,
                           *(ZydisStackWidth *)(&DAT_00124014 + (long)pZVar13 * 4));
  if ((int)ZVar5 < 0) {
    ZydisFuzzTarget_cold_2();
  }
  else {
    if ((ZStack_ac8.mnemonic == ZYDIS_MNEMONIC_UD0) && (ZStack_ac8.operand_count == '\0')) {
      pZVar13 = (ZyanU8 *)0xa;
      ZVar5 = ZydisDecoderEnableMode(&ZStack_aec,ZYDIS_DECODER_MODE_MAX_VALUE,'\x01');
      if ((int)ZVar5 < 0) goto LAB_0010f09d;
    }
    pZVar13 = aZStack_ad7;
    ZVar5 = ZydisDecoderDecodeFull(&ZStack_aec,pZVar13,ZStack_ae0,&ZStack_938,aZStack_7f0);
    if (-1 < (int)ZVar5) {
      ZydisCompareRequestToInstruction(&ZStack_ac8,&ZStack_938,aZStack_7f0,aZStack_ad7);
      ZydisReEncodeInstruction
                (&ZStack_aec,&ZStack_938,aZStack_7f0,ZStack_938.operand_count,aZStack_ad7);
      return;
    }
  }
  ZydisFuzzTarget_cold_4();
LAB_0010f09d:
  ZydisFuzzTarget_cold_3();
  read(0,pZVar13,__nbytes);
  return;
}

Assistant:

void ZydisCompareRequestToInstruction(const ZydisEncoderRequest *request,
    const ZydisDecodedInstruction *insn, const ZydisDecodedOperand* operands, const ZyanU8 *insn_bytes)
{
    // Special case, `xchg rAX, rAX` is an alias for `NOP`
    if ((request->mnemonic == ZYDIS_MNEMONIC_XCHG) &&
        (request->operand_count == 2) &&
        (request->operands[0].type == ZYDIS_OPERAND_TYPE_REGISTER) &&
        (request->operands[1].type == ZYDIS_OPERAND_TYPE_REGISTER) &&
        (request->operands[0].reg.value == request->operands[1].reg.value) &&
        (insn->mnemonic == ZYDIS_MNEMONIC_NOP))
    {
        switch (request->operands[0].reg.value)
        {
        case ZYDIS_REGISTER_AX:
        case ZYDIS_REGISTER_EAX:
        case ZYDIS_REGISTER_RAX:
            return;
        default:
            break;
        }
    }

    // Handle possible KNC overlap
    ZydisDecodedInstruction knc_insn;
    ZydisDecodedOperand knc_operands[ZYDIS_MAX_OPERAND_COUNT];
    if (request->mnemonic != insn->mnemonic)
    {
        ZydisDecoder decoder;
        ZydisStackWidth stack_width = (ZydisStackWidth)(insn->stack_width >> 5);
        if (!ZYAN_SUCCESS(ZydisDecoderInit(&decoder, insn->machine_mode, stack_width)))
        {
            fputs("Failed to initialize decoder\n", ZYAN_STDERR);
            abort();
        }
        if (!ZYAN_SUCCESS(ZydisDecoderEnableMode(&decoder, ZYDIS_DECODER_MODE_KNC, ZYAN_TRUE)))
        {
            fputs("Failed to enable KNC mode\n", ZYAN_STDERR);
            abort();
        }
        if (!ZYAN_SUCCESS(ZydisDecoderDecodeFull(&decoder, insn_bytes, insn->length, &knc_insn,
            knc_operands)))
        {
            fputs("Failed to decode instruction\n", ZYAN_STDERR);
            abort();
        }
        insn = &knc_insn;
        operands = knc_operands;
    }

    ZyanBool prefixes_match = ((insn->attributes & request->prefixes) == request->prefixes);
    if (!prefixes_match &&
        (request->machine_mode != ZYDIS_MACHINE_MODE_LONG_64) &&
        (request->prefixes & ZYDIS_ATTRIB_HAS_SEGMENT_DS))
    {
        // Encoder allows specifying DS override even when it might be interpreted as NOTRACK
        ZyanU64 acceptable_prefixes = (request->prefixes & (~ZYDIS_ATTRIB_HAS_SEGMENT_DS)) |
                                      ZYDIS_ATTRIB_HAS_NOTRACK;
        prefixes_match = ((insn->attributes & acceptable_prefixes) == acceptable_prefixes);
    }
    if ((request->machine_mode != insn->machine_mode) ||
        (request->mnemonic != insn->mnemonic) ||
        (request->operand_count != insn->operand_count_visible) ||
        !prefixes_match)
    {
        fputs("Basic instruction attributes mismatch\n", ZYAN_STDERR);
        abort();
    }

    for (ZyanU8 i = 0; i < insn->operand_count_visible; ++i)
    {
        const ZydisEncoderOperand *op1 = &request->operands[i];
        const ZydisDecodedOperand *op2 = &operands[i];
        if (op1->type != op2->type)
        {
            fprintf(ZYAN_STDERR, "Mismatch for operand %u\n", i);
            abort();
        }
        switch (op1->type)
        {
        case ZYDIS_OPERAND_TYPE_REGISTER:
            if (op1->reg.value != op2->reg.value)
            {
                fprintf(ZYAN_STDERR, "Mismatch for register operand %u\n", i);
                abort();
            }
            break;
        case ZYDIS_OPERAND_TYPE_MEMORY:
            if ((op1->mem.base != op2->mem.base) ||
                (op1->mem.index != op2->mem.index) ||
                (op1->mem.scale != op2->mem.scale && op2->mem.type != ZYDIS_MEMOP_TYPE_MIB) ||
                (op1->mem.displacement != op2->mem.disp.value))
            {
                ZyanBool acceptable_mismatch = ZYAN_FALSE;
                if (op1->mem.displacement != op2->mem.disp.value)
                {
                    if ((op2->mem.disp.size) &&
                        (op1->mem.index == ZYDIS_REGISTER_NONE) &&
                        ((op1->mem.base == ZYDIS_REGISTER_NONE) ||
                         (op1->mem.base == ZYDIS_REGISTER_EIP) ||
                         (op1->mem.base == ZYDIS_REGISTER_RIP)))
                    {
                        ZyanU64 addr;
                        ZydisCalcAbsoluteAddress(insn, op2, 0, &addr);
                        acceptable_mismatch = ((ZyanU64)op1->mem.displacement == addr);
                    }
                    if ((insn->machine_mode == ZYDIS_MACHINE_MODE_REAL_16) ||
                        (insn->machine_mode == ZYDIS_MACHINE_MODE_LEGACY_16) ||
                        (insn->machine_mode == ZYDIS_MACHINE_MODE_LONG_COMPAT_16) ||
                        (insn->stack_width == 16) ||
                        (insn->address_width == 16))
                    {
                        acceptable_mismatch = ((op1->mem.displacement & 0xFFFF) ==
                            (op2->mem.disp.value & 0xFFFF));
                    }
                }
                if (!acceptable_mismatch)
                {
                    fprintf(ZYAN_STDERR, "Mismatch for memory operand %u\n", i);
                    abort();
                }
            }
            break;
        case ZYDIS_OPERAND_TYPE_POINTER:
            if ((op1->ptr.segment != op2->ptr.segment) ||
                (op1->ptr.offset != op2->ptr.offset))
            {
                fprintf(ZYAN_STDERR, "Mismatch for pointer operand %u\n", i);
                abort();
            }
            break;
        case ZYDIS_OPERAND_TYPE_IMMEDIATE:
            if (op1->imm.u != op2->imm.value.u)
            {
                ZyanBool acceptable_mismatch = ZYAN_FALSE;
                if ((insn->meta.category == ZYDIS_CATEGORY_DATAXFER) ||
                    (insn->meta.category == ZYDIS_CATEGORY_LOGICAL))
                {
                    if (op2->size < 64)
                    {
                        ZyanU64 mask = (1ULL << op2->size) - 1;
                        acceptable_mismatch =
                            (op1->imm.u & mask) == (op2->imm.value.u & mask);
                    }
                    else
                    {
                        acceptable_mismatch = op1->imm.u == op2->imm.value.u;
                    }
                }
                if (!acceptable_mismatch)
                {
                    fprintf(ZYAN_STDERR, "Mismatch for immediate operand %u\n", i);
                    abort();
                }
            }
            break;
        default:
            fprintf(ZYAN_STDERR, "Invalid operand type for operand %u\n", i);
            abort();
        }
    }
}